

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_ClassArray<ON_SubDEdgePtr> * __thiscall
ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_>::SetCapacity
          (ON_ClassArray<ON_ClassArray<ON_SubDEdgePtr>_> *this,size_t new_capacity)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  long lVar5;
  undefined4 extraout_var_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ON_ClassArray<ON_SubDEdgePtr> *pOVar4;
  
  uVar2 = this->m_capacity;
  uVar8 = (ulong)uVar2;
  if (uVar8 == 0) {
    this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)0x0;
    this->m_count = 0;
  }
  uVar7 = (uint)new_capacity;
  if (0x7ffffffe < new_capacity - 1 >> 1) {
    uVar7 = 0;
  }
  if ((int)uVar7 < 1) {
    if (this->m_a != (ON_ClassArray<ON_SubDEdgePtr> *)0x0) {
      lVar5 = uVar8 * 0x18;
      while( true ) {
        if ((int)uVar8 < 1) break;
        (*(code *)**(undefined8 **)((long)&this->m_a[-1]._vptr_ON_ClassArray + lVar5))
                  ((long)&this->m_a[-1]._vptr_ON_ClassArray + lVar5);
        uVar8 = (ulong)((int)uVar8 - 1);
        lVar5 = lVar5 + -0x18;
      }
      (*this->_vptr_ON_ClassArray[4])(this,this->m_a,0);
      this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)0x0;
    }
  }
  else if ((int)uVar2 < (int)uVar7) {
    iVar3 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar7);
    pOVar4 = (ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var,iVar3);
    this->m_a = pOVar4;
    if (pOVar4 != (ON_ClassArray<ON_SubDEdgePtr> *)0x0) {
      memset(pOVar4 + this->m_capacity,0,((long)(int)uVar7 - (long)this->m_capacity) * 0x18);
      lVar5 = (long)this->m_capacity;
      lVar6 = lVar5 * 0x18 + 8;
      for (; lVar5 < (long)(ulong)uVar7; lVar5 = lVar5 + 1) {
        pOVar4 = this->m_a;
        *(undefined ***)((long)pOVar4 + lVar6 + -8) = &PTR__ON_ClassArray_0082c350;
        puVar1 = (undefined8 *)((long)&pOVar4->_vptr_ON_ClassArray + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar6 = lVar6 + 0x18;
      }
      this->m_capacity = uVar7;
      goto LAB_0061285c;
    }
  }
  else {
    if (uVar2 <= uVar7) goto LAB_0061285c;
    while ((int)uVar7 < (int)uVar8) {
      uVar8 = (ulong)((int)uVar8 - 1);
      (**this->m_a[uVar8]._vptr_ON_ClassArray)(this->m_a + uVar8);
    }
    if ((int)uVar7 < this->m_count) {
      this->m_count = uVar7;
    }
    this->m_capacity = uVar7;
    iVar3 = (*this->_vptr_ON_ClassArray[4])(this,this->m_a,(ulong)uVar7);
    this->m_a = (ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var_00,iVar3);
    if ((ON_ClassArray<ON_SubDEdgePtr> *)CONCAT44(extraout_var_00,iVar3) !=
        (ON_ClassArray<ON_SubDEdgePtr> *)0x0) goto LAB_0061285c;
  }
  this->m_count = 0;
  this->m_capacity = 0;
LAB_0061285c:
  return this->m_a;
}

Assistant:

T* ON_ClassArray<T>::SetCapacity( size_t new_capacity ) 
{
  if (0 == m_capacity)
  {
    // Allow "expert" users of ON_SimpleArray<>.SetArray(*,*,0) to clean up after themselves
    // and deals with the case when the forget to clean up after themselves.
    m_a = nullptr;
    m_count = 0;
  }
  // uses "placement" for class construction/destruction
  int i;
  int capacity = (new_capacity > 0 && new_capacity < ON_UNSET_UINT_INDEX)
               ? (int)new_capacity 
               : 0;

  if ( capacity <= 0 ) {
    if ( m_a ) {
      for ( i = m_capacity-1; i >= 0; i-- ) {
        DestroyElement(m_a[i]);
      }
      Realloc(m_a,0);
      m_a = 0;
    }
    m_count = 0;
    m_capacity = 0;
  }
  else if ( m_capacity < capacity ) {
    // growing
    m_a = Realloc( m_a, capacity );
    // initialize new elements with default constructor
    if ( 0 != m_a )
    {
      // even when m_a is an array of classes with vtable pointers,
      // this call to memset(..., 0, ...) is what I want to do
      // because in-place construction will be used when needed
      // on this memory.
      memset( (void*)(m_a + m_capacity), 0, (capacity-m_capacity)*sizeof(T) );
      for ( i = m_capacity; i < capacity; i++ ) {
        ConstructDefaultElement(&m_a[i]);
      }
      m_capacity = capacity;
    }
    else
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  else if ( m_capacity > capacity ) {
    // shrinking
    for ( i = m_capacity-1; i >= capacity; i-- ) {
      DestroyElement(m_a[i]);
    }
    if ( m_count > capacity )
      m_count = capacity;
    m_capacity = capacity;
    m_a = Realloc( m_a, capacity );
    if ( 0 == m_a )
    {
      // memory allocation failed
      m_capacity = 0;
      m_count = 0;
    }
  }
  return m_a;
}